

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O0

void screen_byte_2(ubyte iobyte,uint address)

{
  ushort uVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  byte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  ubyte colpix4;
  ubyte colpix3;
  ubyte colpix2;
  ubyte colpix1;
  uint bitsperline;
  uint virt_y_cord;
  uint y_cord;
  uint x_cord;
  uint address_local;
  ubyte iobyte_local;
  
  bitsperline = address;
  if (address < screen_start) {
    bitsperline = address + (-0x8000 - ram_screen_start);
  }
  uVar3 = bitsperline - screen_start;
  uVar1 = (ushort)crt_regs[1];
  uVar4 = (uVar3 / (ushort)(uVar1 << 3)) * 8 + (uVar3 & 7);
  uVar5 = uVar4 + (uVar4 >> 2);
  _colpix2 = (ushort)((ulong)uVar3 % ((ulong)crt_regs[1] << 3)) & 0xfff8;
  bVar2 = iobyte & 0x88;
  if ((iobyte & 0x88) == 0) {
    local_15 = 0;
  }
  else if (bVar2 == 8) {
    local_15 = 2;
  }
  else if (bVar2 == 0x80) {
    local_15 = 8;
  }
  else if (bVar2 == 0x88) {
    local_15 = 10;
  }
  bVar2 = iobyte & 0x44;
  if ((iobyte & 0x44) == 0) {
    local_16 = 0;
  }
  else if (bVar2 == 4) {
    local_16 = 2;
  }
  else if (bVar2 == 0x40) {
    local_16 = 8;
  }
  else if (bVar2 == 0x44) {
    local_16 = 10;
  }
  switch(iobyte & 0x22) {
  case 0:
    local_17 = 0;
    break;
  case 2:
    local_17 = 2;
    break;
  case 0x20:
    local_17 = 8;
    break;
  case 0x22:
    local_17 = 10;
  }
  switch(iobyte & 0x11) {
  case 0:
    local_18 = 0;
    break;
  case 1:
    local_18 = 2;
    break;
  case 0x10:
    local_18 = 8;
    break;
  case 0x11:
    local_18 = 10;
  }
  if (uVar1 == 0x50) {
    putpixel(_colpix2,uVar5,(uint)local_15);
    putpixel(_colpix2 + 1,uVar5,(uint)local_15);
    putpixel(_colpix2 + 2,uVar5,(uint)local_16);
    putpixel(_colpix2 + 3,uVar5,(uint)local_16);
    putpixel(_colpix2 + 4,uVar5,(uint)local_17);
    putpixel(_colpix2 + 5,uVar5,(uint)local_17);
    putpixel(_colpix2 + 6,uVar5,(uint)local_18);
    putpixel(_colpix2 + 7,uVar5,(uint)local_18);
  }
  else {
    _colpix2 = _colpix2 * 2;
    putpixel(_colpix2,uVar5,(uint)local_15);
    putpixel(_colpix2 + 1,uVar5,(uint)local_15);
    putpixel(_colpix2 + 2,uVar5,(uint)local_15);
    putpixel(_colpix2 + 3,uVar5,(uint)local_15);
    putpixel(_colpix2 + 4,uVar5,(uint)local_16);
    putpixel(_colpix2 + 5,uVar5,(uint)local_16);
    putpixel(_colpix2 + 6,uVar5,(uint)local_16);
    putpixel(_colpix2 + 7,uVar5,(uint)local_16);
    putpixel(_colpix2 + 8,uVar5,(uint)local_17);
    putpixel(_colpix2 + 9,uVar5,(uint)local_17);
    putpixel(_colpix2 + 10,uVar5,(uint)local_17);
    putpixel(_colpix2 + 0xb,uVar5,(uint)local_17);
    putpixel(_colpix2 + 0xc,uVar5,(uint)local_18);
    putpixel(_colpix2 + 0xd,uVar5,(uint)local_18);
    putpixel(_colpix2 + 0xe,uVar5,(uint)local_18);
    putpixel(_colpix2 + 0xf,uVar5,(uint)local_18);
  }
  if ((uVar4 & 3) == 0) {
    uVar5 = uVar5 - 1;
    if (uVar1 == 0x50) {
      putpixel(_colpix2,uVar5,(uint)local_15);
      putpixel(_colpix2 + 1,uVar5,(uint)local_15);
      putpixel(_colpix2 + 2,uVar5,(uint)local_16);
      putpixel(_colpix2 + 3,uVar5,(uint)local_16);
      putpixel(_colpix2 + 4,uVar5,(uint)local_17);
      putpixel(_colpix2 + 5,uVar5,(uint)local_17);
      putpixel(_colpix2 + 6,uVar5,(uint)local_18);
      putpixel(_colpix2 + 7,uVar5,(uint)local_18);
    }
    else {
      putpixel(_colpix2,uVar5,(uint)local_15);
      putpixel(_colpix2 + 1,uVar5,(uint)local_15);
      putpixel(_colpix2 + 2,uVar5,(uint)local_15);
      putpixel(_colpix2 + 3,uVar5,(uint)local_15);
      putpixel(_colpix2 + 4,uVar5,(uint)local_16);
      putpixel(_colpix2 + 5,uVar5,(uint)local_16);
      putpixel(_colpix2 + 6,uVar5,(uint)local_16);
      putpixel(_colpix2 + 7,uVar5,(uint)local_16);
      putpixel(_colpix2 + 8,uVar5,(uint)local_17);
      putpixel(_colpix2 + 9,uVar5,(uint)local_17);
      putpixel(_colpix2 + 10,uVar5,(uint)local_17);
      putpixel(_colpix2 + 0xb,uVar5,(uint)local_17);
      putpixel(_colpix2 + 0xc,uVar5,(uint)local_18);
      putpixel(_colpix2 + 0xd,uVar5,(uint)local_18);
      putpixel(_colpix2 + 0xe,uVar5,(uint)local_18);
      putpixel(_colpix2 + 0xf,uVar5,(uint)local_18);
    }
  }
  return;
}

Assistant:

void screen_byte_2(ubyte iobyte, uint address) {
    uint x_cord = 0;         // general x coordinate variable
    uint y_cord = 0;         // general y coordinate variable
    uint virt_y_cord = 0;    // vertically scaled pc y coordinate
    uint bitsperline;      // bits per line variable
    ubyte colpix1;         // colour of pixel 1
    ubyte colpix2;         // colour of pixel 2
    ubyte colpix3;         // colour of pixel 3
    ubyte colpix4;         // colour of pixel 4

    // deal with hardware wraparound
    if (address < screen_start) address += (0x8000 - ram_screen_start);
    address -= screen_start;

    bitsperline = 8 * crt_regs[1];  // calculate bits per scanline

    y_cord = address / bitsperline; // calculate character row
    y_cord *= 8;                  // convert to pixel row
    y_cord += (address % 8);        // add fraction of character offset

    virt_y_cord += y_cord + y_cord / 4; // scale output to fit pc screen

    x_cord = address % bitsperline;  // calculate x character column
    x_cord &= 0xFFF8;              // mask off lower 3 bits

    switch (iobyte & 0x88)                // calculate colour of pixel 1
    {
        case 0x00:
            colpix1 = 0x00;
            break;
        case 0x08:
            colpix1 = 0x02;
            break;
        case 0x80:
            colpix1 = 0x08;
            break;
        case 0x88:
            colpix1 = 0x0A;
            break;
    }

    switch (iobyte & 0x44)                // calculate colour of pixel 2
    {
        case 0x00:
            colpix2 = 0x00;
            break;
        case 0x04:
            colpix2 = 0x02;
            break;
        case 0x40:
            colpix2 = 0x08;
            break;
        case 0x44:
            colpix2 = 0x0A;
            break;
    }

    switch (iobyte & 0x22)                // calculate colour of pixel 3
    {
        case 0x00:
            colpix3 = 0x00;
            break;
        case 0x02:
            colpix3 = 0x02;
            break;
        case 0x20:
            colpix3 = 0x08;
            break;
        case 0x22:
            colpix3 = 0x0A;
            break;
    }

    switch (iobyte & 0x11)                // calcalate colour of pixel 4
    {
        case 0x00:
            colpix4 = 0x00;
            break;
        case 0x01:
            colpix4 = 0x02;
            break;
        case 0x10:
            colpix4 = 0x08;
            break;
        case 0x11:
            colpix4 = 0x0A;
            break;
    }


    if (bitsperline == 640)              // if this is a 40 character mode
    {
        putpixel(x_cord + 0, virt_y_cord, colpix1);
        putpixel(x_cord + 1, virt_y_cord, colpix1);
        putpixel(x_cord + 2, virt_y_cord, colpix2);
        putpixel(x_cord + 3, virt_y_cord, colpix2);
        putpixel(x_cord + 4, virt_y_cord, colpix3);
        putpixel(x_cord + 5, virt_y_cord, colpix3);
        putpixel(x_cord + 6, virt_y_cord, colpix4);
        putpixel(x_cord + 7, virt_y_cord, colpix4);
    }
    else                               // if this is not a 40 character mode
    {
        x_cord <<= 1;                        // scale the x coorinate to fit the scren
        putpixel(x_cord + 0, virt_y_cord, colpix1);
        putpixel(x_cord + 1, virt_y_cord, colpix1);
        putpixel(x_cord + 2, virt_y_cord, colpix1);
        putpixel(x_cord + 3, virt_y_cord, colpix1);
        putpixel(x_cord + 4, virt_y_cord, colpix2);
        putpixel(x_cord + 5, virt_y_cord, colpix2);
        putpixel(x_cord + 6, virt_y_cord, colpix2);
        putpixel(x_cord + 7, virt_y_cord, colpix2);
        putpixel(x_cord + 8, virt_y_cord, colpix3);
        putpixel(x_cord + 9, virt_y_cord, colpix3);
        putpixel(x_cord + 10, virt_y_cord, colpix3);
        putpixel(x_cord + 11, virt_y_cord, colpix3);
        putpixel(x_cord + 12, virt_y_cord, colpix4);
        putpixel(x_cord + 13, virt_y_cord, colpix4);
        putpixel(x_cord + 14, virt_y_cord, colpix4);
        putpixel(x_cord + 15, virt_y_cord, colpix4);
    }

    if (!(y_cord & 3))                      // if the y coordinate was scaled,
    {
        virt_y_cord--;                        // put the pixels on the original line

        if (bitsperline == 640)                 // if this is a 40 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, colpix1);
            putpixel(x_cord + 1, virt_y_cord, colpix1);
            putpixel(x_cord + 2, virt_y_cord, colpix2);
            putpixel(x_cord + 3, virt_y_cord, colpix2);
            putpixel(x_cord + 4, virt_y_cord, colpix3);
            putpixel(x_cord + 5, virt_y_cord, colpix3);
            putpixel(x_cord + 6, virt_y_cord, colpix4);
            putpixel(x_cord + 7, virt_y_cord, colpix4);
        }
        else                                  // if this is not a 40 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, colpix1);
            putpixel(x_cord + 1, virt_y_cord, colpix1);
            putpixel(x_cord + 2, virt_y_cord, colpix1);
            putpixel(x_cord + 3, virt_y_cord, colpix1);
            putpixel(x_cord + 4, virt_y_cord, colpix2);
            putpixel(x_cord + 5, virt_y_cord, colpix2);
            putpixel(x_cord + 6, virt_y_cord, colpix2);
            putpixel(x_cord + 7, virt_y_cord, colpix2);
            putpixel(x_cord + 8, virt_y_cord, colpix3);
            putpixel(x_cord + 9, virt_y_cord, colpix3);
            putpixel(x_cord + 10, virt_y_cord, colpix3);
            putpixel(x_cord + 11, virt_y_cord, colpix3);
            putpixel(x_cord + 12, virt_y_cord, colpix4);
            putpixel(x_cord + 13, virt_y_cord, colpix4);
            putpixel(x_cord + 14, virt_y_cord, colpix4);
            putpixel(x_cord + 15, virt_y_cord, colpix4);
        }

    }

}